

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O1

void __thiscall
cfd::api::json::DecodeRawTransactionResponse::ConvertFromStruct
          (DecodeRawTransactionResponse *this,DecodeRawTransactionResponseStruct *data)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  
  std::__cxx11::string::_M_assign((string *)&this->txid_);
  std::__cxx11::string::_M_assign((string *)&this->hash_);
  uVar1 = data->size;
  uVar2 = data->vsize;
  uVar3 = data->weight;
  this->version_ = data->version;
  this->size_ = uVar1;
  this->vsize_ = uVar2;
  this->weight_ = uVar3;
  this->locktime_ = data->locktime;
  core::JsonObjectVector<cfd::api::json::DecodeRawTransactionTxIn,_DecodeRawTransactionTxInStruct>::
  ConvertFromStruct(&this->vin_,&data->vin);
  core::JsonObjectVector<cfd::api::json::DecodeRawTransactionTxOut,_DecodeRawTransactionTxOutStruct>
  ::ConvertFromStruct(&this->vout_,&data->vout);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->ignore_items)._M_t,&(data->ignore_items)._M_t);
  return;
}

Assistant:

void DecodeRawTransactionResponse::ConvertFromStruct(
    const DecodeRawTransactionResponseStruct& data) {
  txid_ = data.txid;
  hash_ = data.hash;
  version_ = data.version;
  size_ = data.size;
  vsize_ = data.vsize;
  weight_ = data.weight;
  locktime_ = data.locktime;
  vin_.ConvertFromStruct(data.vin);
  vout_.ConvertFromStruct(data.vout);
  ignore_items = data.ignore_items;
}